

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O1

void __thiscall Liby::Connection::runEventHandler(Connection *this,BasicHandler *handler)

{
  EventLoop *pEVar1;
  
  pEVar1 = this->loop_;
  if ((pEVar1 != (EventLoop *)0x0) && (this->poller_ != (Poller *)0x0)) {
    if ((handler->super__Function_base)._M_manager == (_Manager_type)0x0) {
      return;
    }
    EventQueue::pushHandler
              ((pEVar1->equeue_)._M_t.
               super___uniq_ptr_impl<Liby::EventQueue,_std::default_delete<Liby::EventQueue>_>._M_t.
               super__Tuple_impl<0UL,_Liby::EventQueue_*,_std::default_delete<Liby::EventQueue>_>.
               super__Head_base<0UL,_Liby::EventQueue_*,_false>._M_head_impl,handler);
    EventQueue::wakeup((pEVar1->equeue_)._M_t.
                       super___uniq_ptr_impl<Liby::EventQueue,_std::default_delete<Liby::EventQueue>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Liby::EventQueue_*,_std::default_delete<Liby::EventQueue>_>
                       .super__Head_base<0UL,_Liby::EventQueue_*,_false>._M_head_impl);
    return;
  }
  __assert_fail("loop_ && poller_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Connection.cpp"
                ,0x2f,"void Liby::Connection::runEventHandler(const BasicHandler &)");
}

Assistant:

void Connection::runEventHandler(const BasicHandler &handler) {
    assert(loop_ && poller_);

    if (!handler) {
        return;
    }

    loop_->runEventHandler(handler);
}